

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void renameQuotefixFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  long lVar1;
  sqlite3 *db;
  sqlite3_xauth p_Var2;
  Select *p;
  int errCode;
  uchar *zDb;
  uchar *zSql;
  Expr *pExpr;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  Walker local_238;
  RenameCtx local_208;
  Parse sParse;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  db = context->pOut->db;
  zDb = sqlite3_value_text(*argv);
  zSql = sqlite3_value_text(argv[1]);
  p_Var2 = db->xAuth;
  db->xAuth = (sqlite3_xauth)0x0;
  sqlite3BtreeEnterAll(db);
  if (zSql == (uchar *)0x0 || zDb == (uchar *)0x0) goto LAB_0019dbe3;
  memset(&sParse,0xaa,0x1a8);
  errCode = renameParseSql(&sParse,(char *)zDb,db,(char *)zSql,0);
  if (errCode == 0) {
    local_238.u.pNC = (NameContext *)&local_208;
    local_208.pList = (RenameToken *)0x0;
    local_208.nList = 0;
    local_208.iCol = 0;
    local_208.pTab = (Table *)0x0;
    local_208.zOld = (char *)0x0;
    local_238.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
    local_238.walkerDepth = 0;
    local_238.eCode = 0;
    local_238.mWFlags = 0;
    local_238.xExprCallback = renameQuotefixExprCb;
    local_238.xSelectCallback = renameColumnSelectCb;
    local_238.pParse = &sParse;
    if (sParse.pNewTable == (Table *)0x0) {
      if (sParse.pNewIndex == (Index *)0x0) {
        errCode = renameResolveTrigger(&sParse);
        if (errCode != 0) goto LAB_0019db96;
        renameWalkTrigger(&local_238,sParse.pNewTrigger);
      }
      else {
        sqlite3WalkExprList(&local_238,(sParse.pNewIndex)->aColExpr);
        sqlite3WalkExpr(&local_238,(sParse.pNewIndex)->pPartIdxWhere);
      }
LAB_0019db7e:
      errCode = renameEditSql(context,&local_208,(char *)zSql,(char *)0x0,0);
    }
    else {
      if ((sParse.pNewTable)->eTabType != '\x02') {
        sqlite3WalkExprList(&local_238,(sParse.pNewTable)->pCheck);
        lVar4 = 0;
        for (lVar3 = 0; lVar3 < (sParse.pNewTable)->nCol; lVar3 = lVar3 + 1) {
          pExpr = sqlite3ColumnExpr(sParse.pNewTable,
                                    (Column *)((long)&(sParse.pNewTable)->aCol->zCnName + lVar4));
          sqlite3WalkExpr(&local_238,pExpr);
          lVar4 = lVar4 + 0x10;
        }
        goto LAB_0019db7e;
      }
      p = *(Select **)&(sParse.pNewTable)->u;
      p->selFlags = p->selFlags & 0xffdfffff;
      sParse.rc = 0;
      sqlite3SelectPrep(&sParse,p,(NameContext *)0x0);
      errCode = sParse.rc;
      if (db->mallocFailed != '\0') {
        errCode = 7;
      }
      if (errCode == 0) {
        sqlite3WalkSelect(&local_238,p);
        goto LAB_0019db7e;
      }
    }
LAB_0019db96:
    renameTokenFree(db,local_208.pList);
    if (errCode != 0) goto LAB_0019dba7;
  }
  else {
LAB_0019dba7:
    if ((errCode == 1) && (((uint)db->flags & 0x10000001) == 1)) {
      sqlite3_result_value(context,argv[1]);
    }
    else {
      sqlite3_result_error_code(context,errCode);
    }
  }
  renameParseCleanup(&sParse);
LAB_0019dbe3:
  db->xAuth = p_Var2;
  sqlite3BtreeLeaveAll(db);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void renameQuotefixFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  char const *zDb = (const char*)sqlite3_value_text(argv[0]);
  char const *zInput = (const char*)sqlite3_value_text(argv[1]);

#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
  db->xAuth = 0;
#endif

  sqlite3BtreeEnterAll(db);

  UNUSED_PARAMETER(NotUsed);
  if( zDb && zInput ){
    int rc;
    Parse sParse;
    rc = renameParseSql(&sParse, zDb, db, zInput, 0);

    if( rc==SQLITE_OK ){
      RenameCtx sCtx;
      Walker sWalker;

      /* Walker to find tokens that need to be replaced. */
      memset(&sCtx, 0, sizeof(RenameCtx));
      memset(&sWalker, 0, sizeof(Walker));
      sWalker.pParse = &sParse;
      sWalker.xExprCallback = renameQuotefixExprCb;
      sWalker.xSelectCallback = renameColumnSelectCb;
      sWalker.u.pRename = &sCtx;

      if( sParse.pNewTable ){
        if( IsView(sParse.pNewTable) ){
          Select *pSelect = sParse.pNewTable->u.view.pSelect;
          pSelect->selFlags &= ~SF_View;
          sParse.rc = SQLITE_OK;
          sqlite3SelectPrep(&sParse, pSelect, 0);
          rc = (db->mallocFailed ? SQLITE_NOMEM : sParse.rc);
          if( rc==SQLITE_OK ){
            sqlite3WalkSelect(&sWalker, pSelect);
          }
        }else{
          int i;
          sqlite3WalkExprList(&sWalker, sParse.pNewTable->pCheck);
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
          for(i=0; i<sParse.pNewTable->nCol; i++){
            sqlite3WalkExpr(&sWalker,
               sqlite3ColumnExpr(sParse.pNewTable,
                                         &sParse.pNewTable->aCol[i]));
          }
#endif /* SQLITE_OMIT_GENERATED_COLUMNS */
        }
      }else if( sParse.pNewIndex ){
        sqlite3WalkExprList(&sWalker, sParse.pNewIndex->aColExpr);
        sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
      }else{
#ifndef SQLITE_OMIT_TRIGGER
        rc = renameResolveTrigger(&sParse);
        if( rc==SQLITE_OK ){
          renameWalkTrigger(&sWalker, sParse.pNewTrigger);
        }
#endif /* SQLITE_OMIT_TRIGGER */
      }

      if( rc==SQLITE_OK ){
        rc = renameEditSql(context, &sCtx, zInput, 0, 0);
      }
      renameTokenFree(db, sCtx.pList);
    }
    if( rc!=SQLITE_OK ){
      if( sqlite3WritableSchema(db) && rc==SQLITE_ERROR ){
        sqlite3_result_value(context, argv[1]);
      }else{
        sqlite3_result_error_code(context, rc);
      }
    }
    renameParseCleanup(&sParse);
  }

#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif

  sqlite3BtreeLeaveAll(db);
}